

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.cpp
# Opt level: O3

size_t __thiscall chatra::Tuple::find(Tuple *this,StringTable *sTable,StringId key)

{
  pointer pbVar1;
  pointer pcVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  size_t *psVar5;
  key_type local_48;
  StringId local_24 [2];
  StringId key_local;
  
  local_24[0] = key;
  cVar3 = std::
          _Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_unsigned_long>,_std::allocator<std::pair<const_chatra::StringId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->sidToIndex)._M_h,local_24);
  if (cVar3.super__Node_iterator_base<std::pair<const_chatra::StringId,_unsigned_long>,_false>.
      _M_cur == (__node_type *)0x0) {
    pbVar1 = (sTable->idToStr).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar2 = pbVar1[local_24[0]]._M_dataplus._M_p;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar2,pcVar2 + pbVar1[local_24[0]]._M_string_length);
    cVar4 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->strToIndex)._M_h,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if (cVar4.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
        ._M_cur == (__node_type *)0x0) {
      return 0xffffffffffffffff;
    }
    psVar5 = (size_t *)
             ((long)cVar4.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                    ._M_cur + 0x28);
  }
  else {
    psVar5 = (size_t *)
             ((long)cVar3.
                    super__Node_iterator_base<std::pair<const_chatra::StringId,_unsigned_long>,_false>
                    ._M_cur + 0x10);
  }
  return *psVar5;
}

Assistant:

size_t Tuple::find(const StringTable* sTable, StringId key) const {
	auto it0 = sidToIndex.find(key);
	if (it0 != sidToIndex.end())
		return it0->second;

	auto it1 = strToIndex.find(sTable->ref(key));
	if (it1 != strToIndex.end())
		return it1->second;

	return SIZE_MAX;
}